

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

uint64_t SSL_get_dtls_write_sequence(SSL *ssl,uint16_t epoch)

{
  int iVar1;
  DTLSWriteEpoch *this;
  DTLSWriteEpoch *write_epoch;
  uint16_t epoch_local;
  SSL *ssl_local;
  
  iVar1 = SSL_is_dtls(ssl);
  if (iVar1 == 0) {
    abort();
  }
  this = bssl::dtls_get_write_epoch(ssl,epoch);
  if (this == (DTLSWriteEpoch *)0x0) {
    ssl_local = (SSL *)0xffffffffffffffff;
  }
  else {
    ssl_local = (SSL *)bssl::DTLSRecordNumber::sequence(&this->next_record);
  }
  return (uint64_t)ssl_local;
}

Assistant:

uint64_t SSL_get_dtls_write_sequence(const SSL *ssl, uint16_t epoch) {
  BSSL_CHECK(SSL_is_dtls(ssl));
  const DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    return UINT64_MAX;
  }
  return write_epoch->next_record.sequence();
}